

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_avx2.c
# Opt level: O1

double av1_estimate_noise_from_single_plane_avx2
                 (uint8_t *src,int height,int width,int stride,int edge_thresh)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  uint uVar18;
  undefined1 auVar19 [32];
  int iVar20;
  ulong uVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  int iVar24;
  uint8_t *puVar25;
  int iVar26;
  uint8_t *puVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  ulong uVar31;
  uint8_t *puVar32;
  uint8_t *puVar33;
  int stride_0;
  int iVar34;
  ulong uVar35;
  undefined2 uVar36;
  double dVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 local_218 [32];
  long local_1f8;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  
  iVar20 = width + -1;
  uVar21 = (long)iVar20 & 0xffffffffffffffe0;
  auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  lVar28 = (long)stride;
  local_1d8 = auVar38;
  if (1 < (int)(uint)uVar21) {
    uVar36 = (undefined2)edge_thresh;
    iVar24 = stride * 2 + 1;
    uVar35 = 1;
    auVar39 = ZEXT1664((undefined1  [16])0x0);
    local_1d8 = ZEXT1632(ZEXT816(0));
    do {
      if (height < 3) {
        local_1b8._0_16_ = ZEXT816(0);
        local_1b8 = ZEXT1632(local_1b8._0_16_);
      }
      else {
        puVar22 = src + uVar35 + lVar28;
        local_138 = *(undefined8 *)puVar22;
        uStack_130 = *(undefined8 *)(puVar22 + 8);
        uStack_128 = *(undefined8 *)(puVar22 + 0x10);
        uStack_120 = *(undefined8 *)(puVar22 + 0x18);
        auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar38 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + uVar35 + lVar28 + 1),auVar41);
        auVar7 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + uVar35 + lVar28 + -1),auVar41);
        auVar42 = vpaddw_avx2(auVar38,auVar7);
        auVar10 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + uVar35 + lVar28 + 1),auVar41);
        auVar11 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + uVar35 + lVar28 + -1),auVar41);
        auVar3 = vpaddw_avx2(auVar10,auVar11);
        auVar4 = vpsubw_avx2(auVar7,auVar38);
        auVar10 = vpsubw_avx2(auVar11,auVar10);
        auVar38 = *(undefined1 (*) [32])(src + uVar35);
        auVar11 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + uVar35 + 1),auVar41);
        auVar8 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + (uVar35 - 1)),auVar41);
        auVar7 = vpaddw_avx2(auVar11,auVar8);
        auVar12 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + uVar35 + 1),auVar41);
        auVar41 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + (uVar35 - 1)),auVar41);
        local_218 = vpaddw_avx2(auVar12,auVar41);
        auVar11 = vpsubw_avx2(auVar8,auVar11);
        auVar8 = vpsubw_avx2(auVar41,auVar12);
        local_1b8._0_16_ = ZEXT816(0);
        local_1b8 = ZEXT1632(local_1b8._0_16_);
        lVar29 = (ulong)(height - 1) - 1;
        iVar30 = iVar24;
        do {
          auVar19 = auVar3;
          auVar16 = auVar42;
          auVar12 = *(undefined1 (*) [32])(src + iVar30);
          auVar42 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar13 = vpunpcklbw_avx2(auVar38,auVar42);
          auVar43 = vpunpckhbw_avx2(auVar38,auVar42);
          auVar3 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + (long)iVar30 + -1),auVar42);
          auVar38 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + (long)iVar30 + -1),auVar42);
          auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar14 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + (long)iVar30 + 1),auVar40);
          auVar42 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + (long)iVar30 + 1),auVar40);
          auVar15 = vpunpcklbw_avx2(auVar12,auVar40);
          auVar9 = vpunpckhbw_avx2(auVar12,auVar40);
          auVar41 = vpsubw_avx2(auVar3,auVar14);
          auVar5 = vpsubw_avx2(auVar38,auVar42);
          auVar3 = vpaddw_avx2(auVar3,auVar14);
          auVar42 = vpaddw_avx2(auVar42,auVar38);
          auVar14 = vpsubw_avx2(auVar13,auVar15);
          auVar38 = vpaddw_avx2(auVar10,auVar10);
          auVar38 = vpaddw_avx2(auVar8,auVar38);
          auVar6 = vpsubw_avx2(local_218,auVar3);
          auVar8 = vpaddw_avx2(auVar14,auVar14);
          auVar8 = vpaddw_avx2(auVar6,auVar8);
          auVar14 = vpsubw_avx2(auVar43,auVar9);
          auVar38 = vpaddw_avx2(auVar41,auVar38);
          auVar38 = vpabsw_avx2(auVar38);
          auVar8 = vpabsw_avx2(auVar8);
          auVar8 = vpaddw_avx2(auVar38,auVar8);
          auVar38 = vpaddw_avx2(auVar4,auVar4);
          auVar38 = vpaddw_avx2(auVar38,auVar11);
          auVar6 = vpsubw_avx2(auVar7,auVar42);
          auVar11 = vpaddw_avx2(auVar14,auVar14);
          auVar11 = vpaddw_avx2(auVar11,auVar6);
          auVar38 = vpaddw_avx2(auVar5,auVar38);
          auVar38 = vpabsw_avx2(auVar38);
          auVar11 = vpabsw_avx2(auVar11);
          auVar38 = vpaddw_avx2(auVar38,auVar11);
          auVar14._2_2_ = uVar36;
          auVar14._0_2_ = uVar36;
          auVar14._4_2_ = uVar36;
          auVar14._6_2_ = uVar36;
          auVar14._8_2_ = uVar36;
          auVar14._10_2_ = uVar36;
          auVar14._12_2_ = uVar36;
          auVar14._14_2_ = uVar36;
          auVar14._16_2_ = uVar36;
          auVar14._18_2_ = uVar36;
          auVar14._20_2_ = uVar36;
          auVar14._22_2_ = uVar36;
          auVar14._24_2_ = uVar36;
          auVar14._26_2_ = uVar36;
          auVar14._28_2_ = uVar36;
          auVar14._30_2_ = uVar36;
          auVar11 = vpcmpgtw_avx2(auVar14,auVar8);
          auVar8 = vpcmpgtw_avx2(auVar14,auVar38);
          auVar38 = vpaddw_avx2(auVar8,auVar11);
          if ((((((((((((((((((((((((((((((((auVar38 >> 7 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar38 >> 0xf & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar38 >> 0x17 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar38 >> 0x1f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar38 >> 0x27 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar38 >> 0x2f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar38 >> 0x37 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar38 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar38 >> 0x47 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar38 >> 0x4f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar38 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar38 >> 0x5f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar38 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar38 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar38 >> 0x77 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar38 >> 0x7f,0) == '\0') &&
                            (auVar38 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar38 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar38 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar38 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar38 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar38 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar38 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0xbf,0) == '\0') &&
                    (auVar38 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar38 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar38 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar38 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar38 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar38 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar38 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              -1 < auVar38[0x1f]) {
            auVar38._8_8_ = uStack_130;
            auVar38._0_8_ = local_138;
            auVar38._16_8_ = uStack_128;
            auVar38._24_8_ = uStack_120;
          }
          else {
            auVar38 = vpaddw_avx2(auVar19,auVar13);
            auVar14 = vpaddw_avx2(auVar15,auVar38);
            auVar38 = vpaddw_avx2(auVar16,auVar43);
            auVar6 = vpaddw_avx2(auVar38,auVar9);
            auVar38._8_8_ = uStack_130;
            auVar38._0_8_ = local_138;
            auVar38._16_8_ = uStack_128;
            auVar38._24_8_ = uStack_120;
            auVar43 = vpunpcklbw_avx2(auVar38,auVar40);
            auVar9 = vpunpckhbw_avx2(auVar38,auVar40);
            auVar43 = vpsllw_avx2(auVar43,2);
            auVar43 = vpaddw_avx2(auVar43,local_218);
            auVar43 = vpaddw_avx2(auVar3,auVar43);
            auVar14 = vpaddw_avx2(auVar14,auVar14);
            auVar14 = vpsubw_avx2(auVar43,auVar14);
            auVar14 = vpabsw_avx2(auVar14);
            auVar43 = vpsllw_avx2(auVar9,2);
            auVar7 = vpaddw_avx2(auVar7,auVar43);
            auVar7 = vpaddw_avx2(auVar42,auVar7);
            auVar6 = vpaddw_avx2(auVar6,auVar6);
            auVar7 = vpsubw_avx2(auVar7,auVar6);
            auVar7 = vpabsw_avx2(auVar7);
            auVar14 = vpand_avx2(auVar11,auVar14);
            auVar6 = vpand_avx2(auVar8,auVar7);
            auVar7 = vpsubw_avx2(local_1b8,auVar11);
            local_1b8 = vpsubw_avx2(auVar7,auVar8);
            auVar7 = vpunpcklwd_avx2(auVar14,auVar40);
            auVar7 = vpaddd_avx2(auVar7,local_1d8);
            auVar11 = vpunpckhwd_avx2(auVar14,auVar40);
            auVar8 = vpunpcklwd_avx2(auVar6,auVar40);
            auVar11 = vpaddd_avx2(auVar11,auVar8);
            auVar7 = vpaddd_avx2(auVar7,auVar11);
            auVar11 = vpunpckhwd_avx2(auVar6,auVar40);
            local_1d8 = vpaddd_avx2(auVar7,auVar11);
          }
          iVar30 = iVar30 + stride;
          local_138 = auVar12._0_8_;
          uStack_130 = auVar12._8_8_;
          uStack_128 = auVar12._16_8_;
          uStack_120 = auVar12._24_8_;
          lVar29 = lVar29 + -1;
          auVar11 = auVar4;
          auVar8 = auVar10;
          auVar10 = auVar41;
          auVar7 = auVar16;
          auVar4 = auVar5;
          local_218 = auVar19;
        } while (lVar29 != 0);
      }
      auVar42 = vpunpcklwd_avx2(local_1b8,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar38 = vpunpckhwd_avx2(local_1b8,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar38 = vpaddd_avx2(auVar38,auVar39._0_32_);
      auVar38 = vpaddd_avx2(auVar38,auVar42);
      auVar39 = ZEXT3264(auVar38);
      uVar35 = uVar35 + 0x20;
      iVar24 = iVar24 + 0x20;
    } while (uVar35 < ((long)iVar20 & 0xffffffe0U));
  }
  if (height < 3) {
    local_1f8 = 0;
    auVar42._24_8_ = 0;
    auVar42._0_24_ = local_218._8_24_;
    local_218 = auVar42 << 0x40;
  }
  else {
    puVar22 = src + lVar28 * 2 + 2;
    puVar32 = src + lVar28 + 2;
    puVar27 = src + 2;
    auVar3._24_8_ = 0;
    auVar3._0_24_ = local_218._8_24_;
    local_218 = auVar3 << 0x40;
    uVar35 = 1;
    local_1f8 = 0;
    do {
      puVar23 = puVar22;
      puVar25 = puVar27;
      uVar31 = (long)width - 2;
      puVar33 = puVar32;
      if ((int)((uint)uVar21 | 1) < iVar20) {
        do {
          auVar42 = local_218;
          iVar24 = ((((uint)puVar25[uVar21 - 2] + (uint)puVar23[uVar21 - 2]) - (uint)puVar25[uVar21]
                    ) - (uint)puVar23[uVar21]) +
                   ((uint)puVar33[uVar21 - 2] - (uint)puVar33[uVar21]) * 2;
          iVar26 = (uint)puVar25[uVar21] + (uint)puVar25[uVar21 - 2];
          iVar34 = (uint)puVar23[uVar21 - 2] + (uint)puVar23[uVar21];
          iVar30 = (iVar26 - iVar34) + ((uint)puVar25[uVar21 - 1] - (uint)puVar23[uVar21 - 1]) * 2;
          iVar17 = -iVar24;
          if (0 < iVar24) {
            iVar17 = iVar24;
          }
          iVar24 = -iVar30;
          if (0 < iVar30) {
            iVar24 = iVar30;
          }
          if (iVar24 + iVar17 < edge_thresh) {
            uVar1 = iVar26 + iVar34 +
                    ((uint)puVar25[uVar21 - 1] + (uint)puVar23[uVar21 - 1] +
                    (uint)puVar33[uVar21] + (uint)puVar33[uVar21 - 2]) * -2 +
                    (uint)puVar33[uVar21 - 1] * 4;
            uVar18 = -uVar1;
            if (0 < (int)uVar1) {
              uVar18 = uVar1;
            }
            local_1f8 = local_1f8 + (ulong)uVar18;
            iVar24 = local_218._0_4_;
            local_218._4_4_ = 0;
            local_218._0_4_ = iVar24 + 1;
            local_218._8_24_ = auVar42._8_24_;
          }
          puVar23 = puVar23 + 1;
          puVar33 = puVar33 + 1;
          puVar25 = puVar25 + 1;
          uVar31 = uVar31 - 1;
        } while (uVar21 != uVar31);
      }
      uVar35 = uVar35 + 1;
      puVar22 = puVar22 + lVar28;
      puVar32 = puVar32 + lVar28;
      puVar27 = puVar27 + lVar28;
    } while (uVar35 != height - 1);
  }
  auVar38 = vphaddd_avx2(local_1d8,auVar38);
  auVar2 = vpaddd_avx(auVar38._16_16_,auVar38._0_16_);
  auVar2 = vphaddd_avx(auVar2,auVar2);
  iVar20 = auVar2._12_4_ + local_218._0_4_;
  if (iVar20 < 0x10) {
    dVar37 = -1.0;
  }
  else {
    auVar2 = vpshufd_avx(auVar2,0x50);
    dVar37 = ((double)(local_1f8 + auVar2._0_4_) / (double)(iVar20 * 6)) * 1.25331413732;
  }
  return dVar37;
}

Assistant:

double av1_estimate_noise_from_single_plane_avx2(const uint8_t *src, int height,
                                                 int width, int stride,
                                                 int edge_thresh) {
  int count = 0;
  int64_t accum = 0;
  // w32 stores width multiple of 32.
  const int w32 = (width - 1) & ~0x1f;
  const __m256i zero = _mm256_setzero_si256();
  const __m256i edge_threshold = _mm256_set1_epi16(edge_thresh);
  __m256i num_accumulator = zero;
  __m256i sum_accumulator = zero;

  //  A | B | C
  //  D | E | F
  //  G | H | I
  // g_x = (A - C) + (G - I) + 2*(D - F)
  // g_y = (A + C) - (G + I) + 2*(B - H)
  // v   = 4*E - 2*(D+F+B+H) + (A+C+G+I)

  // Process the width multiple of 32 here.
  for (int w = 1; w < w32; w += 32) {
    int h = 1;
    const int start_idx = h * stride + w;
    const int stride_0 = start_idx - stride;

    __m256i num_accum_row_lvl = zero;
    const __m256i A = _mm256_loadu_si256((__m256i *)(&src[stride_0 - 1]));
    const __m256i C = _mm256_loadu_si256((__m256i *)(&src[stride_0 + 1]));
    const __m256i D = _mm256_loadu_si256((__m256i *)(&src[start_idx - 1]));
    const __m256i F = _mm256_loadu_si256((__m256i *)(&src[start_idx + 1]));
    __m256i B = _mm256_loadu_si256((__m256i *)(&src[stride_0]));
    __m256i E = _mm256_loadu_si256((__m256i *)(&src[start_idx]));

    const __m256i A_lo = _mm256_unpacklo_epi8(A, zero);
    const __m256i A_hi = _mm256_unpackhi_epi8(A, zero);
    const __m256i C_lo = _mm256_unpacklo_epi8(C, zero);
    const __m256i C_hi = _mm256_unpackhi_epi8(C, zero);
    const __m256i D_lo = _mm256_unpacklo_epi8(D, zero);
    const __m256i D_hi = _mm256_unpackhi_epi8(D, zero);
    const __m256i F_lo = _mm256_unpacklo_epi8(F, zero);
    const __m256i F_hi = _mm256_unpackhi_epi8(F, zero);

    __m256i sub_AC_lo = _mm256_sub_epi16(A_lo, C_lo);
    __m256i sub_AC_hi = _mm256_sub_epi16(A_hi, C_hi);
    __m256i sum_AC_lo = _mm256_add_epi16(A_lo, C_lo);
    __m256i sum_AC_hi = _mm256_add_epi16(A_hi, C_hi);
    __m256i sub_DF_lo = _mm256_sub_epi16(D_lo, F_lo);
    __m256i sub_DF_hi = _mm256_sub_epi16(D_hi, F_hi);
    __m256i sum_DF_lo = _mm256_add_epi16(D_lo, F_lo);
    __m256i sum_DF_hi = _mm256_add_epi16(D_hi, F_hi);

    for (; h < height - 1; h++) {
      __m256i sum_GI_lo, sub_GI_lo, sum_GI_hi, sub_GI_hi, gx_lo, gy_lo, gx_hi,
          gy_hi;
      const int k = h * stride + w;
      const __m256i G = _mm256_loadu_si256((__m256i *)(&src[k + stride - 1]));
      const __m256i H = _mm256_loadu_si256((__m256i *)(&src[k + stride]));
      const __m256i I = _mm256_loadu_si256((__m256i *)(&src[k + stride + 1]));

      const __m256i B_lo = _mm256_unpacklo_epi8(B, zero);
      const __m256i B_hi = _mm256_unpackhi_epi8(B, zero);
      const __m256i G_lo = _mm256_unpacklo_epi8(G, zero);
      const __m256i G_hi = _mm256_unpackhi_epi8(G, zero);
      const __m256i I_lo = _mm256_unpacklo_epi8(I, zero);
      const __m256i I_hi = _mm256_unpackhi_epi8(I, zero);
      const __m256i H_lo = _mm256_unpacklo_epi8(H, zero);
      const __m256i H_hi = _mm256_unpackhi_epi8(H, zero);

      sub_GI_lo = _mm256_sub_epi16(G_lo, I_lo);
      sub_GI_hi = _mm256_sub_epi16(G_hi, I_hi);
      sum_GI_lo = _mm256_add_epi16(G_lo, I_lo);
      sum_GI_hi = _mm256_add_epi16(G_hi, I_hi);
      const __m256i sub_BH_lo = _mm256_sub_epi16(B_lo, H_lo);
      const __m256i sub_BH_hi = _mm256_sub_epi16(B_hi, H_hi);

      CALC_X_GRADIENT(sub_AC_lo, sub_GI_lo, sub_DF_lo, gx_lo)
      CALC_Y_GRADIENT(sum_AC_lo, sum_GI_lo, sub_BH_lo, gy_lo)

      const __m256i ga_lo = _mm256_add_epi16(gx_lo, gy_lo);

      CALC_X_GRADIENT(sub_AC_hi, sub_GI_hi, sub_DF_hi, gx_hi)
      CALC_Y_GRADIENT(sum_AC_hi, sum_GI_hi, sub_BH_hi, gy_hi)

      const __m256i ga_hi = _mm256_add_epi16(gx_hi, gy_hi);

      __m256i cmp_lo = _mm256_cmpgt_epi16(edge_threshold, ga_lo);
      __m256i cmp_hi = _mm256_cmpgt_epi16(edge_threshold, ga_hi);
      const __m256i comp_reg = _mm256_add_epi16(cmp_lo, cmp_hi);

      // v = 4*E -2*(D+F+B+H) + (A+C+G+I)
      if (_mm256_movemask_epi8(comp_reg) != 0) {
        const __m256i sum_BH_lo = _mm256_add_epi16(B_lo, H_lo);
        const __m256i sum_BH_hi = _mm256_add_epi16(B_hi, H_hi);

        // 2*(D+F+B+H)
        const __m256i sum_DFBH_lo =
            _mm256_slli_epi16(_mm256_add_epi16(sum_DF_lo, sum_BH_lo), 1);
        // (A+C+G+I)
        const __m256i sum_ACGI_lo = _mm256_add_epi16(sum_AC_lo, sum_GI_lo);
        const __m256i sum_DFBH_hi =
            _mm256_slli_epi16(_mm256_add_epi16(sum_DF_hi, sum_BH_hi), 1);
        const __m256i sum_ACGI_hi = _mm256_add_epi16(sum_AC_hi, sum_GI_hi);

        // Convert E register values from 8bit to 16bit
        const __m256i E_lo = _mm256_unpacklo_epi8(E, zero);
        const __m256i E_hi = _mm256_unpackhi_epi8(E, zero);

        // 4*E - 2*(D+F+B+H)+ (A+C+G+I)
        const __m256i var_lo_0 = _mm256_abs_epi16(_mm256_add_epi16(
            _mm256_sub_epi16(_mm256_slli_epi16(E_lo, 2), sum_DFBH_lo),
            sum_ACGI_lo));
        const __m256i var_hi_0 = _mm256_abs_epi16(_mm256_add_epi16(
            _mm256_sub_epi16(_mm256_slli_epi16(E_hi, 2), sum_DFBH_hi),
            sum_ACGI_hi));
        cmp_lo = _mm256_srli_epi16(cmp_lo, 15);
        cmp_hi = _mm256_srli_epi16(cmp_hi, 15);
        const __m256i var_lo = _mm256_mullo_epi16(var_lo_0, cmp_lo);
        const __m256i var_hi = _mm256_mullo_epi16(var_hi_0, cmp_hi);

        num_accum_row_lvl = _mm256_add_epi16(num_accum_row_lvl, cmp_lo);
        num_accum_row_lvl = _mm256_add_epi16(num_accum_row_lvl, cmp_hi);

        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpacklo_epi16(var_lo, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpackhi_epi16(var_lo, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpacklo_epi16(var_hi, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpackhi_epi16(var_hi, zero));
      }
      sub_AC_lo = sub_DF_lo;
      sub_AC_hi = sub_DF_hi;
      sub_DF_lo = sub_GI_lo;
      sub_DF_hi = sub_GI_hi;
      sum_AC_lo = sum_DF_lo;
      sum_AC_hi = sum_DF_hi;
      sum_DF_lo = sum_GI_lo;
      sum_DF_hi = sum_GI_hi;
      B = E;
      E = H;
    }
    const __m256i num_0 = _mm256_unpacklo_epi16(num_accum_row_lvl, zero);
    const __m256i num_1 = _mm256_unpackhi_epi16(num_accum_row_lvl, zero);
    num_accumulator =
        _mm256_add_epi32(num_accumulator, _mm256_add_epi32(num_0, num_1));
  }

  // Process the remaining width here.
  for (int h = 1; h < height - 1; ++h) {
    for (int w = w32 + 1; w < width - 1; ++w) {
      const int k = h * stride + w;

      // Compute sobel gradients
      const int g_x = (src[k - stride - 1] - src[k - stride + 1]) +
                      (src[k + stride - 1] - src[k + stride + 1]) +
                      2 * (src[k - 1] - src[k + 1]);
      const int g_y = (src[k - stride - 1] - src[k + stride - 1]) +
                      (src[k - stride + 1] - src[k + stride + 1]) +
                      2 * (src[k - stride] - src[k + stride]);
      const int ga = abs(g_x) + abs(g_y);

      if (ga < edge_thresh) {
        // Find Laplacian
        const int v =
            4 * src[k] -
            2 * (src[k - 1] + src[k + 1] + src[k - stride] + src[k + stride]) +
            (src[k - stride - 1] + src[k - stride + 1] + src[k + stride - 1] +
             src[k + stride + 1]);
        accum += abs(v);
        ++count;
      }
    }
  }

  // s0 s1 n0 n1 s2 s3 n2 n3
  __m256i sum_avx = _mm256_hadd_epi32(sum_accumulator, num_accumulator);
  __m128i sum_avx_lo = _mm256_castsi256_si128(sum_avx);
  __m128i sum_avx_hi = _mm256_extractf128_si256(sum_avx, 1);
  // s0+s2 s1+s3 n0+n2 n1+n3
  __m128i sum_avx_1 = _mm_add_epi32(sum_avx_lo, sum_avx_hi);
  // s0+s2+s1+s3 n0+n2+n1+n3
  __m128i result = _mm_add_epi32(_mm_srli_si128(sum_avx_1, 4), sum_avx_1);

  accum += _mm_cvtsi128_si32(result);
  count += _mm_extract_epi32(result, 2);

  // If very few smooth pels, return -1 since the estimate is unreliable.
  return (count < 16) ? -1.0 : (double)accum / (6 * count) * SQRT_PI_BY_2;
}